

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f operator*(float f,Quat4f *q)

{
  Quat4f *in_RSI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 extraout_XMM0_Qa;
  ulong uVar5;
  Quat4f QVar6;
  Quat4f *q_local;
  float f_local;
  
  fVar1 = Quat4f::w(in_RSI);
  fVar2 = Quat4f::x(in_RSI);
  fVar3 = Quat4f::y(in_RSI);
  fVar4 = Quat4f::z(in_RSI);
  uVar5 = (ulong)(uint)(f * fVar2);
  Quat4f::Quat4f(q,f * fVar1,f * fVar2,f * fVar3,f * fVar4);
  QVar6.m_elements[2] = (float)(int)uVar5;
  QVar6.m_elements[3] = (float)(int)(uVar5 >> 0x20);
  QVar6.m_elements[0] = (float)(int)extraout_XMM0_Qa;
  QVar6.m_elements[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Quat4f)QVar6.m_elements;
}

Assistant:

Quat4f operator * ( float f, const Quat4f& q )
{
	return Quat4f
	(
		f * q.w(),
		f * q.x(),
		f * q.y(),
		f * q.z()
	);
}